

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

Memory * __thiscall wasm::WasmBinaryReader::getMemory(WasmBinaryReader *this,Index index)

{
  pointer puVar1;
  string local_40;
  
  puVar1 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(this->wasm->memories).
                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (Memory *)
           (_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
           *(_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_> *)
            &puVar1[index]._M_t.
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Memory index out of range.","");
  throwError(this,&local_40);
}

Assistant:

Memory* WasmBinaryReader::getMemory(Index index) {
  if (index < wasm.memories.size()) {
    return wasm.memories[index].get();
  }
  throwError("Memory index out of range.");
}